

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_array_reduce(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int special)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong idx;
  JSValueUnion JVar7;
  long lVar8;
  int64_t iVar9;
  JSValueUnion JVar10;
  long lVar11;
  JSRefCountHeader *p;
  int64_t iVar12;
  JSValueUnion JVar13;
  bool bVar14;
  JSValue v;
  JSValue obj;
  JSValue func_obj;
  JSValue v_00;
  JSValue v_01;
  JSValue JVar15;
  JSValue JVar16;
  uint local_fc;
  JSValueUnion local_f8;
  int64_t iStack_f0;
  JSValueUnion local_e8;
  int64_t local_e0;
  long local_d8;
  JSValueUnion local_d0;
  int64_t local_c8;
  JSValueUnion local_c0;
  int64_t local_b8;
  ulong local_b0;
  int64_t len;
  JSValueUnion local_a0;
  int64_t local_98;
  JSValue local_90;
  ulong local_80;
  JSValueUnion local_78;
  int64_t iStack_70;
  JSValueUnion local_68;
  int64_t local_60;
  JSValueUnion local_58;
  int64_t local_50;
  JSValueUnion local_48;
  int64_t local_40;
  
  local_f8.ptr = (void *)(local_f8 << 0x20);
  local_e8.ptr = (void *)(local_e8 << 0x20);
  iStack_f0 = 3;
  local_b8 = 3;
  local_e0 = 3;
  if ((special & 8U) == 0) {
    this_val = JS_ToObject(ctx,this_val);
    iVar2 = js_get_length64(ctx,&len,this_val);
    if (iVar2 == 0) {
LAB_001536ca:
      iVar9 = this_val.tag;
      JVar13 = this_val.u;
      local_b0 = CONCAT44(local_b0._4_4_,argc);
      JVar10 = (JSValueUnion)(argv->u).ptr;
      iVar12 = argv->tag;
      iVar2 = check_function(ctx,*argv);
      if (iVar2 == 0) {
        local_c0 = JVar10;
        local_98 = iVar12;
        if ((int)local_b0 < 2) {
          lVar11 = 0;
          local_d8 = len;
          lVar8 = 0;
          if (0 < len) {
            lVar8 = len;
          }
          lVar4 = -1;
          do {
            lVar3 = lVar4;
            if (lVar8 == lVar11) {
              JS_ThrowTypeError(ctx,"empty array");
              goto LAB_001536e8;
            }
            lVar4 = lVar3 + local_d8;
            if ((special & 1U) == 0) {
              lVar4 = lVar11;
            }
            if ((special & 8U) != 0) {
              _local_f8 = JS_GetPropertyInt64(ctx,this_val,lVar4);
              JVar16 = _local_f8;
              if (local_f8._8_4_ != 6) goto LAB_0015386a;
              goto LAB_001536e8;
            }
            iVar2 = JS_TryGetPropertyInt64(ctx,this_val,lVar4,(JSValue *)&local_f8);
            if (iVar2 < 0) goto LAB_001536e8;
            lVar11 = lVar11 + 1;
            lVar4 = lVar3 + -1;
          } while (iVar2 == 0);
          _local_d0 = _local_f8;
          JVar16 = _local_d0;
LAB_0015386a:
          _local_d0 = JVar16;
          uVar5 = -lVar3;
          lVar8 = local_d8;
        }
        else {
          piVar1 = (int *)argv[1].u.ptr;
          _local_d0 = argv[1];
          if (0xfffffff4 < (uint)argv[1].tag) {
            *piVar1 = *piVar1 + 1;
          }
          uVar5 = 0;
          lVar8 = len;
        }
        local_fc = special & 1;
        uVar6 = ~uVar5 + lVar8;
        local_b8 = 3;
        JVar10 = local_c0;
        _local_f8 = _local_d0;
        local_d8 = lVar8;
        local_a0 = JVar13;
        while (this_val.tag = iVar9, this_val.u.ptr = JVar13.ptr, (long)uVar5 < lVar8) {
          idx = uVar6;
          if (local_fc == 0) {
            idx = uVar5;
          }
          local_b0 = uVar5;
          local_80 = uVar6;
          if ((special & 8U) == 0) {
            obj.tag = iVar9;
            obj.u.ptr = JVar13.ptr;
            iVar2 = JS_TryGetPropertyInt64(ctx,obj,idx,(JSValue *)&local_e8);
            if (iVar2 < 0) {
              local_b8 = local_e0;
              goto LAB_001536e8;
            }
            if (iVar2 != 0) goto LAB_0015391c;
          }
          else {
            JVar16.tag = iVar9;
            JVar16.u.ptr = JVar13.ptr;
            _local_e8 = JS_GetPropertyInt64(ctx,JVar16,idx);
            if (local_e8._8_4_ == 6) {
              local_b8 = local_e8;
              goto LAB_001536e8;
            }
LAB_0015391c:
            bVar14 = (long)(int)idx == idx;
            JVar7.float64 = (double)(long)idx;
            if (bVar14) {
              JVar7.ptr = (void *)(idx & 0xffffffff);
            }
            iVar12 = 7;
            if (bVar14) {
              iVar12 = 0;
            }
            local_78 = local_f8;
            iStack_70 = iStack_f0;
            local_68 = local_e8;
            local_60 = local_e0;
            func_obj.tag = local_98;
            func_obj.u.float64 = JVar10.float64;
            local_90 = _local_e8;
            local_58 = JVar7;
            local_50 = iVar12;
            local_48 = JVar13;
            local_40 = iVar9;
            JVar16 = JS_Call(ctx,func_obj,(JSValue)(ZEXT816(3) << 0x40),4,(JSValue *)&local_78);
            v_00.tag = iVar12;
            v_00.u.float64 = JVar7.float64;
            JS_FreeValue(ctx,v_00);
            JS_FreeValue(ctx,local_90);
            local_e8.ptr = (void *)(local_e8 << 0x20);
            local_e0 = 3;
            if ((int)JVar16.tag == 6) {
              this_val.u.ptr = local_a0.ptr;
              goto LAB_001536e8;
            }
            JS_FreeValue(ctx,_local_d0);
            lVar8 = local_d8;
            JVar10 = local_c0;
            JVar13 = local_a0;
            _local_f8 = JVar16;
            _local_d0 = JVar16;
          }
          uVar6 = local_80 - 1;
          uVar5 = local_b0 + 1;
        }
        v_01.tag = iVar9;
        v_01.u.ptr = JVar13.ptr;
        JS_FreeValue(ctx,v_01);
        goto LAB_0015371f;
      }
    }
  }
  else {
    if (0xfffffff4 < (uint)this_val.tag) {
      *(int *)this_val.u.ptr = *this_val.u.ptr + 1;
    }
    iVar2 = js_typed_array_get_length_internal(ctx,this_val);
    len = (int64_t)iVar2;
    if (-1 < iVar2) goto LAB_001536ca;
  }
LAB_001536e8:
  JS_FreeValue(ctx,_local_f8);
  v.tag = local_b8;
  v.u.float64 = local_e8.float64;
  JS_FreeValue(ctx,v);
  JS_FreeValue(ctx,this_val);
  local_c8 = 6;
  local_d0.float64 = 0.0;
LAB_0015371f:
  JVar15.tag = local_c8;
  JVar15.u.float64 = local_d0.float64;
  return JVar15;
}

Assistant:

static JSValue js_array_reduce(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv, int special)
{
    JSValue obj, val, index_val, acc, acc1;
    JSValueConst args[4];
    JSValueConst func;
    int64_t len, k, k1;
    int present;

    acc = JS_UNDEFINED;
    val = JS_UNDEFINED;
    if (special & special_TA) {
        obj = JS_DupValue(ctx, this_val);
        len = js_typed_array_get_length_internal(ctx, obj);
        if (len < 0)
            goto exception;
    } else {
        obj = JS_ToObject(ctx, this_val);
        if (js_get_length64(ctx, &len, obj))
            goto exception;
    }
    func = argv[0];

    if (check_function(ctx, func))
        goto exception;

    k = 0;
    if (argc > 1) {
        acc = JS_DupValue(ctx, argv[1]);
    } else {
        for(;;) {
            if (k >= len) {
                JS_ThrowTypeError(ctx, "empty array");
                goto exception;
            }
            k1 = (special & special_reduceRight) ? len - k - 1 : k;
            k++;
            if (special & special_TA) {
                acc = JS_GetPropertyInt64(ctx, obj, k1);
                if (JS_IsException(acc))
                    goto exception;
                break;
            } else {
                present = JS_TryGetPropertyInt64(ctx, obj, k1, &acc);
                if (present < 0)
                    goto exception;
                if (present)
                    break;
            }
        }
    }
    for (; k < len; k++) {
        k1 = (special & special_reduceRight) ? len - k - 1 : k;
        if (special & special_TA) {
            val = JS_GetPropertyInt64(ctx, obj, k1);
            if (JS_IsException(val))
                goto exception;
            present = TRUE;
        } else {
            present = JS_TryGetPropertyInt64(ctx, obj, k1, &val);
            if (present < 0)
                goto exception;
        }
        if (present) {
            index_val = JS_NewInt64(ctx, k1);
            if (JS_IsException(index_val))
                goto exception;
            args[0] = acc;
            args[1] = val;
            args[2] = index_val;
            args[3] = obj;
            acc1 = JS_Call(ctx, func, JS_UNDEFINED, 4, args);
            JS_FreeValue(ctx, index_val);
            JS_FreeValue(ctx, val);
            val = JS_UNDEFINED;
            if (JS_IsException(acc1))
                goto exception;
            JS_FreeValue(ctx, acc);
            acc = acc1;
        }
    }
    JS_FreeValue(ctx, obj);
    return acc;

exception:
    JS_FreeValue(ctx, acc);
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}